

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<4UL>::SymDiffSplice
          (Geobucket<4UL> *this,MP<6UL,_GF2::MOGrevlex<6UL>_> *polyRight)

{
  Geobucket<4UL> *this_00;
  reference pvVar1;
  size_type sVar2;
  size_t sVar3;
  size_type sVar4;
  reference polyRight_00;
  vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  *in_RDI;
  size_t j;
  size_t i;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_00000058;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_00000060;
  reference in_stack_ffffffffffffffb0;
  size_type local_18;
  
  local_18 = 0;
  while( true ) {
    sVar2 = local_18;
    this_00 = (Geobucket<4UL> *)
              MP<6UL,_GF2::MOGrevlex<6UL>_>::Size((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c581b);
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1),
                        local_18);
    if (this_00 <= (Geobucket<4UL> *)*pvVar1) break;
    local_18 = local_18 + 1;
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1));
    if (local_18 == sVar2) {
      NewBucket(this_00);
    }
  }
  std::
  vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>::
  operator[](in_RDI,local_18);
  MP<6UL,_GF2::MOGrevlex<6UL>_>::SymDiffSplice(in_stack_00000060,in_stack_00000058);
  while( true ) {
    std::
    vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
    ::operator[](in_RDI,sVar2);
    sVar3 = MP<6UL,_GF2::MOGrevlex<6UL>_>::Size((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c58b2);
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1),
                        local_18);
    if (sVar3 <= *pvVar1) break;
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1));
    if (local_18 + 1 == sVar4) {
      NewBucket(this_00);
    }
    in_stack_ffffffffffffffb0 =
         std::
         vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
         ::operator[](in_RDI,sVar2);
    local_18 = local_18 + 1;
    std::
    vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
    ::operator[](in_RDI,local_18);
    MP<6UL,_GF2::MOGrevlex<6UL>_>::SymDiffSplice(in_stack_00000060,in_stack_00000058);
    std::
    vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
    ::operator[](in_RDI,local_18);
    SetEmpty((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c595e);
  }
  polyRight_00 = std::
                 vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                 ::operator[](in_RDI,local_18);
  std::
  vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>::
  operator[](in_RDI,sVar2);
  Swap(in_stack_ffffffffffffffb0,polyRight_00);
  return;
}

Assistant:

void SymDiffSplice(MP& polyRight)
		{
			// поиск подходящей корзины 
			size_t i = 0, j;
			for (; polyRight.Size() > _maxsizes[i];)
				// корзины закончились?
				if (++i == _maxsizes.size()) NewBucket();
			// добавляем мономы в найденную корзину
			_buckets[j = i].SymDiffSplice(polyRight);
			while (_buckets[j].Size() > _maxsizes[i])
			{
				// корзины закончились?
				if (i + 1 == _maxsizes.size()) NewBucket();
				// перераспределяем мономы по корзинам 
				_buckets[j].SymDiffSplice(_buckets[++i]);
				_buckets[i].SetEmpty();
			}
			// меняем содержимое i-й и j-й корзин
			_buckets[i].Swap(_buckets[j]);
		}